

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void end_scope(ch_compilation *comp,uint8_t last_scope_size)

{
  ch_scope *pcVar1;
  byte bVar2;
  long lVar3;
  ch_op *data_start;
  ch_emit_scope *blob;
  ch_op op_1;
  ch_op op;
  
  bVar2 = comp->scope->locals_size - last_scope_size;
  if (bVar2 != 0) {
    for (lVar3 = -1; pcVar1 = comp->scope, lVar3 + (ulong)bVar2 != -1; lVar3 = lVar3 + -1) {
      if (pcVar1->locals[(ulong)pcVar1->locals_size + lVar3].is_captured == true) {
        op = OP_CLOSE_UPVALUE;
        blob = (comp->emit).emit_scope;
        data_start = &op;
      }
      else {
        op_1 = OP_POP;
        blob = (comp->emit).emit_scope;
        data_start = &op_1;
      }
      ch_emit_write(&blob->bytecode,data_start,1);
    }
    pcVar1->locals_size = last_scope_size;
  }
  return;
}

Assistant:

void end_scope(ch_compilation *comp, uint8_t last_scope_size) {
  if (last_scope_size != comp->scope->locals_size) {
    uint8_t num_values_popped = comp->scope->locals_size - last_scope_size;

    for(uint8_t i = 0; i < num_values_popped; i++) {
      if (comp->scope->locals[comp->scope->locals_size - i - 1].is_captured) {
        EMIT_OP(GET_EMIT(comp), OP_CLOSE_UPVALUE);
      } else {
        EMIT_OP(GET_EMIT(comp), OP_POP);
      }
    }

    comp->scope->locals_size = last_scope_size;
  }
}